

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

void __thiscall QMimeData::setData(QMimeData *this,QString *mimeType,QByteArray *data)

{
  long lVar1;
  bool bVar2;
  QMimeDataPrivate *in_RSI;
  long in_FS_OFFSET;
  QMimeDataPrivate *d;
  QByteArrayView ba;
  QList<QVariant> *in_stack_fffffffffffffee8;
  QLatin1StringView *in_stack_fffffffffffffef0;
  QString *in_stack_fffffffffffffef8;
  QByteArrayView *in_stack_ffffffffffffff00;
  QVariant *in_stack_ffffffffffffff20;
  QString *in_stack_ffffffffffffff28;
  QString *format;
  QMimeDataPrivate *this_00;
  QByteArrayView local_68;
  QLatin1StringView local_58;
  QByteArrayView in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMimeData *)0x3e6d05);
  this_00 = in_RSI;
  local_58 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
  bVar2 = ::operator==(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (bVar2) {
    local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_ffffffffffffff00,(QByteArray *)in_stack_fffffffffffffef8);
    bVar2 = QByteArrayView::endsWith
                      (in_stack_ffffffffffffff00,(char)((ulong)in_stack_fffffffffffffef8 >> 0x38));
    if (bVar2) {
      QByteArrayView::chop(&local_68,1);
    }
    dataToUrls(in_stack_ffffffffffffffe0);
    format = (QString *)&stack0xffffffffffffffd8;
    ::QVariant::QVariant((QVariant *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    QMimeDataPrivate::setData(this_00,format,(QVariant *)in_RSI);
    ::QVariant::~QVariant((QVariant *)in_stack_fffffffffffffef0);
    QList<QVariant>::~QList((QList<QVariant> *)0x3e6e34);
  }
  else {
    ::QVariant::QVariant
              ((QVariant *)in_stack_fffffffffffffef0,(QByteArray *)in_stack_fffffffffffffee8);
    QMimeDataPrivate::setData(this_00,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    ::QVariant::~QVariant((QVariant *)in_stack_fffffffffffffef0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeData::setData(const QString &mimeType, const QByteArray &data)
{
    Q_D(QMimeData);

    if (mimeType == "text/uri-list"_L1) {
        auto ba = QByteArrayView(data);
        if (ba.endsWith('\0'))
            ba.chop(1);
        d->setData(mimeType, dataToUrls(ba));
    } else {
        d->setData(mimeType, QVariant(data));
    }
}